

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte_encode.c
# Opt level: O0

size_t streamvbyte_encode(uint32_t *in,uint32_t count,uint8_t *out)

{
  uint uVar1;
  uint8_t *puVar2;
  uint32_t *in_RDX;
  int in_ESI;
  uint8_t *dataPtr;
  uint32_t keyLen;
  uint8_t *keyPtr;
  undefined4 in_stack_ffffffffffffffd8;
  
  uVar1 = in_ESI + 3U >> 2;
  puVar2 = svb_encode_scalar(in_RDX,(uint8_t *)in_RDX,
                             (uint8_t *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                             (uint32_t)((long)in_RDX + (ulong)uVar1 >> 0x20));
  return (long)puVar2 - (long)in_RDX;
}

Assistant:

size_t streamvbyte_encode(const uint32_t *in, uint32_t count, uint8_t *out) {
#ifdef __AVX__
return streamvbyte_encode_SSSE3(in,count,out);
#else
  uint8_t *keyPtr = out;
  uint32_t keyLen = (count + 3) / 4;  // 2-bits rounded to full byte
  uint8_t *dataPtr = keyPtr + keyLen; // variable byte data after all keys

#if defined(__ARM_NEON__)

  uint32_t count_quads = count / 4;
  count -= 4 * count_quads;

  for (uint32_t c = 0; c < count_quads; c++) {
    dataPtr += streamvbyte_encode_quad(in, dataPtr, keyPtr);
    keyPtr++;
    in += 4;
  }

#endif

  return svb_encode_scalar(in, keyPtr, dataPtr, count) - out;
#endif// no AVX
}